

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueue_Correct_Max::test_method(test_CheckQueue_Correct_Max *this)

{
  long lVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000020;
  CheckQueueTest *in_stack_00000028;
  vector<unsigned_long,_std::allocator<unsigned_long>_> range;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_ffffffffffffff88);
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x186a0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_ffffffffffffff88,(value_type_conflict *)0x4bd06c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_ffffffffffffffe0,__x);
  CheckQueueTest::Correct_Queue_range(in_stack_00000028,in_stack_00000020);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Correct_Max)
{
    std::vector<size_t> range;
    range.push_back(100000);
    Correct_Queue_range(range);
}